

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounds_checks.h
# Opt level: O0

void * snmalloc::report_fatal_bounds_error<void*>(void *ptr,size_t len,char *msg)

{
  void *object_end;
  void *range_end;
  void *p;
  void *in_stack_000003b0;
  void *in_stack_000003b8;
  void *in_stack_000003c0;
  void *in_stack_000003c8;
  char *in_stack_000003d0;
  char *in_stack_000003d8;
  unsigned_long in_stack_00000530;
  void *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  
  external_pointer<(snmalloc::Boundary)2,_snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
            (in_stack_ffffffffffffff80);
  external_pointer<(snmalloc::Boundary)0,_snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
            (in_stack_ffffffffffffff78);
  report_fatal_error<1024ul,char_const*,char_const*,void*,void*,void*,void*,unsigned_long>
            (in_stack_000003d8,in_stack_000003d0,in_stack_000003c8,in_stack_000003c0,
             in_stack_000003b8,in_stack_000003b0,in_stack_00000530);
}

Assistant:

SNMALLOC_SLOW_PATH SNMALLOC_UNUSED_FUNCTION inline FakeReturn
  report_fatal_bounds_error(const void* ptr, size_t len, const char* msg)
  {
    if constexpr (FailFast)
    {
      UNUSED(ptr, len, msg);
      SNMALLOC_FAST_FAIL();
    }
    else
    {
      void* p = const_cast<void*>(ptr);

      auto range_end = pointer_offset(p, len);
      auto object_end = external_pointer<OnePastEnd>(p);
      report_fatal_error(
        "Fatal Error!\n{}: \n\trange [{}, {})\n\tallocation [{}, "
        "{})\nrange goes beyond allocation by {} bytes \n",
        msg,
        p,
        range_end,
        external_pointer<Start>(p),
        object_end,
        pointer_diff(object_end, range_end));
    }
  }